

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

JitPolyEquivalentTypeGuard * __thiscall
Func::CreatePolyEquivalentTypeGuard(Func *this,uint32 objTypeSpecFldId)

{
  int iVar1;
  JitPolyEquivalentTypeGuard *guard;
  long lVar2;
  
  EnsureEquivalentTypeGuards(this);
  guard = (JitPolyEquivalentTypeGuard *)
          new<NativeCodeData::AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard>>
                    (0x60,(AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard> *)
                          &this->topFunc->nativeCodeDataAllocator,0x432206);
  iVar1 = this->indexedPropertyGuardCount;
  this->indexedPropertyGuardCount = iVar1 + 1;
  (guard->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.super_PropertyGuard.value = 1;
  *(int *)&(guard->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.super_PropertyGuard.
           field_0xc = iVar1;
  (guard->super_JitEquivalentTypeGuard).cache = (EquivalentTypeCache *)0x0;
  (guard->super_JitEquivalentTypeGuard).objTypeSpecFldId = objTypeSpecFldId;
  (guard->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.super_PropertyGuard.isPoly =
       true;
  (guard->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.super_PropertyGuard.
  wasReincarnated = false;
  lVar2 = 4;
  do {
    guard->polyValues[lVar2 + -4] = 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xc);
  InitializeEquivalentTypeGuard(this,(JitEquivalentTypeGuard *)guard);
  return guard;
}

Assistant:

Js::JitPolyEquivalentTypeGuard*
Func::CreatePolyEquivalentTypeGuard(uint32 objTypeSpecFldId)
{
    EnsureEquivalentTypeGuards();

    Js::JitPolyEquivalentTypeGuard* guard = NativeCodeDataNewNoFixup(GetNativeCodeDataAllocator(), Js::JitPolyEquivalentTypeGuard, this->indexedPropertyGuardCount++, objTypeSpecFldId);

    this->InitializeEquivalentTypeGuard(guard);

    return guard;
}